

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O3

string * __thiscall
cmExportInstallFileGenerator::GetFileSetDirectories_abi_cxx11_
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this,cmGeneratorTarget *gte,
          cmFileSet *fileSet,cmTargetExport *te)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long *plVar3;
  size_type sVar4;
  cmMakefile *this_00;
  bool bVar5;
  bool bVar6;
  cmFileSet *pcVar7;
  mapped_type *ppcVar8;
  string *psVar9;
  ostream *poVar10;
  string *__return_storage_ptr___00;
  WrapQuotes wrapQuotes;
  pointer config;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  string_view str;
  string_view separator;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  string dest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resultVector;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmGeneratorExpression ge;
  ostringstream e;
  undefined1 local_2e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0 [2];
  cmFileSet *local_2b0;
  string local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  cmExportInstallFileGenerator *local_238;
  string *local_230;
  string local_228;
  undefined1 local_1f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  undefined8 local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  undefined8 local_168;
  char *local_160;
  ios_base local_138 [264];
  
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b0 = fileSet;
  local_238 = this;
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_270,gte->Makefile,IncludeEmptyConfig);
  local_258._M_ptr = (element_type *)0x0;
  local_258._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_258);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_1f8,(cmListFileBacktrace *)&local_258);
  if (local_258._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_258._M_refcount._M_pi);
  }
  ppcVar8 = std::
            map<cmFileSet_*,_cmInstallFileSetGenerator_*,_std::less<cmFileSet_*>,_std::allocator<std::pair<cmFileSet_*const,_cmInstallFileSetGenerator_*>_>_>
            ::at(&te->FileSetGenerators,&local_2b0);
  pcVar2 = ((*ppcVar8)->super_cmInstallGenerator).Destination._M_dataplus._M_p;
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,pcVar2,
             pcVar2 + ((*ppcVar8)->super_cmInstallGenerator).Destination._M_string_length);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_2e8,(string *)local_1f8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  local_230 = local_270.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_270.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_270.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_228.field_2;
    local_240 = &__return_storage_ptr__->field_2;
    config = local_270.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      __return_storage_ptr___00 = (string *)(local_2e8 + 8);
      local_228._M_string_length = 0;
      local_228.field_2._M_local_buf[0] = '\0';
      wrapQuotes = Wrap;
      local_228._M_dataplus._M_p = (pointer)paVar1;
      psVar9 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)local_2e8._0_8_,gte->LocalGenerator,
                          config,gte,(cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0
                          ,&local_228);
      str._M_str = (char *)0x1;
      str._M_len = (size_t)(psVar9->_M_dataplus)._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                (__return_storage_ptr___00,(cmOutputConverter *)psVar9->_M_string_length,str,
                 wrapQuotes);
      local_1a8._0_8_ = (_func_int **)0x12;
      local_1a8._8_8_ = "${_IMPORT_PREFIX}/";
      local_198 = local_2d8;
      local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e8._8_8_;
      views._M_len = 2;
      views._M_array = (iterator)local_1a8;
      cmCatViews_abi_cxx11_(&local_2a8,views);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._8_8_ != local_2d0) {
        operator_delete((void *)local_2e8._8_8_,
                        CONCAT71(local_2d0[0]._M_allocated_capacity._1_7_,
                                 local_2d0[0]._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar1) {
        operator_delete(local_228._M_dataplus._M_p,
                        CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                 local_228.field_2._M_local_buf[0]) + 1);
      }
      pcVar7 = local_2b0;
      if (*(bool *)(local_2e8._0_8_ + 0x130) == true) {
        plVar3 = (long *)(local_2b0->Type)._M_dataplus._M_p;
        sVar4 = (local_2b0->Type)._M_string_length;
        if (sVar4 == 0x17) {
          auVar11[0] = -((char)*plVar3 == 'C');
          auVar11[1] = -(*(char *)((long)plVar3 + 1) == 'X');
          auVar11[2] = -(*(char *)((long)plVar3 + 2) == 'X');
          auVar11[3] = -(*(char *)((long)plVar3 + 3) == '_');
          auVar11[4] = -(*(char *)((long)plVar3 + 4) == 'M');
          auVar11[5] = -(*(char *)((long)plVar3 + 5) == 'O');
          auVar11[6] = -(*(char *)((long)plVar3 + 6) == 'D');
          auVar11[7] = -(*(char *)((long)plVar3 + 7) == 'U');
          auVar11[8] = -((char)plVar3[1] == 'L');
          auVar11[9] = -(*(char *)((long)plVar3 + 9) == 'E');
          auVar11[10] = -(*(char *)((long)plVar3 + 10) == '_');
          auVar11[0xb] = -(*(char *)((long)plVar3 + 0xb) == 'H');
          auVar11[0xc] = -(*(char *)((long)plVar3 + 0xc) == 'E');
          auVar11[0xd] = -(*(char *)((long)plVar3 + 0xd) == 'A');
          auVar11[0xe] = -(*(char *)((long)plVar3 + 0xe) == 'D');
          auVar11[0xf] = -(*(char *)((long)plVar3 + 0xf) == 'E');
          auVar12[0] = -(*(char *)((long)plVar3 + 7) == 'U');
          auVar12[1] = -((char)plVar3[1] == 'L');
          auVar12[2] = -(*(char *)((long)plVar3 + 9) == 'E');
          auVar12[3] = -(*(char *)((long)plVar3 + 10) == '_');
          auVar12[4] = -(*(char *)((long)plVar3 + 0xb) == 'H');
          auVar12[5] = -(*(char *)((long)plVar3 + 0xc) == 'E');
          auVar12[6] = -(*(char *)((long)plVar3 + 0xd) == 'A');
          auVar12[7] = -(*(char *)((long)plVar3 + 0xe) == 'D');
          auVar12[8] = -(*(char *)((long)plVar3 + 0xf) == 'E');
          auVar12[9] = -((char)plVar3[2] == 'R');
          auVar12[10] = -(*(char *)((long)plVar3 + 0x11) == '_');
          auVar12[0xb] = -(*(char *)((long)plVar3 + 0x12) == 'U');
          auVar12[0xc] = -(*(char *)((long)plVar3 + 0x13) == 'N');
          auVar12[0xd] = -(*(char *)((long)plVar3 + 0x14) == 'I');
          auVar12[0xe] = -(*(char *)((long)plVar3 + 0x15) == 'T');
          auVar12[0xf] = -(*(char *)((long)plVar3 + 0x16) == 'S');
          auVar12 = auVar12 & auVar11;
          if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) != 0xffff) goto LAB_004edb27;
LAB_004edcec:
          this_00 = local_238->IEGen->LocalGenerator->Makefile;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"The \"",5);
          psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(gte);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(psVar9->_M_dataplus)._M_p,
                               psVar9->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"\" target\'s interface file set \"",0x1f);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(local_2b0->Name)._M_dataplus._M_p,
                               (local_2b0->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" of type \"",0xb);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(pcVar7->Type)._M_dataplus._M_p,
                               (pcVar7->Type)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,
                     "\" contains context-sensitive base file entries which is not supported.",0x46)
          ;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(this_00,FATAL_ERROR,(string *)(local_2e8 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._8_8_ != local_2d0) {
            operator_delete((void *)local_2e8._8_8_,
                            CONCAT71(local_2d0[0]._M_allocated_capacity._1_7_,
                                     local_2d0[0]._M_local_buf[0]) + 1);
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_240;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          bVar5 = false;
        }
        else {
          if ((sVar4 == 0xb) &&
             (*(long *)((long)plVar3 + 3) == 0x53454c55444f4d5f && *plVar3 == 0x55444f4d5f585843))
          goto LAB_004edcec;
LAB_004edb27:
          if ((long)local_270.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_270.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x20) goto LAB_004edb41;
          local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(config->_M_dataplus)._M_p;
          local_198 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)config->_M_string_length;
          local_1a8._0_8_ = (_func_int **)0xc;
          local_1a8._8_8_ = "\"$<$<CONFIG:";
          local_188 = 2;
          local_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x6dc665;
          local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2a8._M_string_length;
          local_170 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2a8._M_dataplus._M_p;
          local_168 = 2;
          local_160 = ">\"";
          views_01._M_len = 5;
          views_01._M_array = (iterator)local_1a8;
          cmCatViews_abi_cxx11_(__return_storage_ptr___00,views_01);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_288
                     ,__return_storage_ptr___00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._8_8_ != local_2d0) {
            operator_delete((void *)local_2e8._8_8_,
                            CONCAT71(local_2d0[0]._M_allocated_capacity._1_7_,
                                     local_2d0[0]._M_local_buf[0]) + 1);
          }
          bVar5 = true;
        }
        bVar6 = false;
      }
      else {
LAB_004edb41:
        local_228._M_dataplus._M_p = (pointer)0x1;
        local_228.field_2._M_local_buf[0] = '\"';
        local_1a8._0_8_ = (_func_int **)0x1;
        local_198 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a8._M_string_length;
        local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a8._M_dataplus._M_p;
        local_2e8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x1;
        local_2d8 = local_2d0;
        local_2d0[0]._M_local_buf[0] = '\"';
        local_188 = 1;
        views_00._M_len = 3;
        views_00._M_array = (iterator)local_1a8;
        local_228._M_string_length = (size_type)paVar1;
        local_1a8._8_8_ = paVar1;
        local_180 = local_2d8;
        cmCatViews_abi_cxx11_((string *)(local_1f8 + 0x10),views_00);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_288,
                   (string *)(local_1f8 + 0x10));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._16_8_ != &local_1d8) {
          operator_delete((void *)local_1f8._16_8_,local_1d8._M_allocated_capacity + 1);
        }
        bVar6 = true;
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if (!bVar5) {
        if (!bVar6) goto LAB_004ede90;
        break;
      }
      config = config + 1;
    } while (config != local_230);
  }
  separator._M_str = " ";
  separator._M_len = 1;
  cmJoin(__return_storage_ptr__,&local_288,separator,(string_view)ZEXT816(0));
LAB_004ede90:
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_2e8);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_270);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportInstallFileGenerator::GetFileSetDirectories(
  cmGeneratorTarget* gte, cmFileSet* fileSet, cmTargetExport* te)
{
  std::vector<std::string> resultVector;

  auto configs =
    gte->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  cmGeneratorExpression ge;
  auto cge = ge.Parse(te->FileSetGenerators.at(fileSet)->GetDestination());

  for (auto const& config : configs) {
    auto dest = cmStrCat("${_IMPORT_PREFIX}/",
                         cmOutputConverter::EscapeForCMake(
                           cge->Evaluate(gte->LocalGenerator, config, gte),
                           cmOutputConverter::WrapQuotes::NoWrap));

    auto const& type = fileSet->GetType();
    // C++ modules do not support interface file sets which are dependent upon
    // the configuration.
    if (cge->GetHadContextSensitiveCondition() &&
        (type == "CXX_MODULES"_s || type == "CXX_MODULE_HEADER_UNITS"_s)) {
      auto* mf = this->IEGen->GetLocalGenerator()->GetMakefile();
      std::ostringstream e;
      e << "The \"" << gte->GetName() << "\" target's interface file set \""
        << fileSet->GetName() << "\" of type \"" << type
        << "\" contains context-sensitive base file entries which is not "
           "supported.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return std::string{};
    }

    if (cge->GetHadContextSensitiveCondition() && configs.size() != 1) {
      resultVector.push_back(
        cmStrCat("\"$<$<CONFIG:", config, ">:", dest, ">\""));
    } else {
      resultVector.push_back(cmStrCat('"', dest, '"'));
      break;
    }
  }

  return cmJoin(resultVector, " ");
}